

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::sign_paytoanchor::test_method(sign_paytoanchor *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar3;
  char *local_5b8;
  char *local_5b0;
  undefined8 local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  PayToAnchor local_578;
  CMutableTransaction curr;
  CMutableTransaction prev;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_4e8;
  undefined1 local_460 [24];
  int *piStack_448;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  sig_data.complete = false;
  sig_data.witness = false;
  p_Var1 = &sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&sig_data.scriptSig,0,0xb8);
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CMutableTransaction::CMutableTransaction(&prev);
  CMutableTransaction::CMutableTransaction(&curr);
  local_5a8 = (char *)((ulong)local_5a8._4_4_ << 0x20);
  PayToAnchor::PayToAnchor(&local_578);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PayToAnchor,void,void,PayToAnchor,void>
            ((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              *)&local_4e8._M_first,&local_578);
  GetScriptForDestination((CScript *)local_460,(CTxDestination *)&local_4e8._M_first);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&prev.vout,(int *)&local_5a8,
             (CScript *)local_460);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_460);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_4e8._M_first);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_578.super_WitnessUnknown.m_program.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CMutableTransaction::GetHash((Txid *)local_460,&prev);
  local_4e8._16_8_ = local_460._16_8_;
  local_4e8._24_8_ = piStack_448;
  local_4e8._0_8_ = local_460._0_8_;
  local_4e8._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&curr.vin,(COutPoint *)&local_4e8._M_first);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x50e;
  file.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_598,msg);
  CTransaction::CTransaction((CTransaction *)&local_4e8._M_first,&prev);
  local_578.super_WitnessUnknown.m_version._0_1_ =
       (class_property<bool>)
       SignSignature(&keystore.super_SigningProvider,(CTransaction *)&local_4e8._M_first,&curr,0,1,
                     &sig_data);
  local_578.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_578.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5a8 = "SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data)";
  local_5a0 = "";
  local_460[8] = '\0';
  local_460._0_8_ = &PTR__lazy_ostream_0113a070;
  local_460._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5b0 = "";
  piStack_448 = (int *)&local_5a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_578,(lazy_ostream *)local_460,1,0,WARN,_cVar3,
             (size_t)&local_5b8,0x50e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_578.super_WitnessUnknown.m_program.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8));
  CTransaction::~CTransaction((CTransaction *)&local_4e8._M_first);
  CMutableTransaction::~CMutableTransaction(&curr);
  CMutableTransaction::~CMutableTransaction(&prev);
  SignatureData::~SignatureData(&sig_data);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_paytoanchor)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;
    prev.vout.emplace_back(0, GetScriptForDestination(PayToAnchor{}));

    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});

    BOOST_CHECK(SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}